

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O0

string * __thiscall
Catch::StringMaker<unsigned_long_long,void>::convert_abi_cxx11_
          (string *__return_storage_ptr__,StringMaker<unsigned_long_long,void> *this,
          unsigned_long_long value)

{
  ReusableStringStream *pRVar1;
  char local_3d [13];
  undefined1 local_30 [8];
  ReusableStringStream rss;
  unsigned_long_long value_local;
  
  rss.m_oss = (ostream *)this;
  ReusableStringStream::ReusableStringStream((ReusableStringStream *)local_30);
  ReusableStringStream::operator<<
            ((ReusableStringStream *)local_30,(unsigned_long_long *)&rss.m_oss);
  if ((ostream *)0xff < rss.m_oss) {
    pRVar1 = ReusableStringStream::operator<<((ReusableStringStream *)local_30,(char (*) [5])" (0x")
    ;
    pRVar1 = ReusableStringStream::operator<<(pRVar1,clara::std::hex);
    pRVar1 = ReusableStringStream::operator<<(pRVar1,(unsigned_long_long *)&rss.m_oss);
    local_3d[0] = ')';
    ReusableStringStream::operator<<(pRVar1,local_3d);
  }
  ReusableStringStream::str_abi_cxx11_(__return_storage_ptr__,(ReusableStringStream *)local_30);
  ReusableStringStream::~ReusableStringStream((ReusableStringStream *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string StringMaker<unsigned long long>::convert(unsigned long long value) {
    ReusableStringStream rss;
    rss << value;
    if (value > Detail::hexThreshold) {
        rss << " (0x" << std::hex << value << ')';
    }
    return rss.str();
}